

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O2

Flow * __thiscall
wasm::ExpressionRunner<wasm::ModuleRunner>::visitRefIsNull
          (Flow *__return_storage_ptr__,ExpressionRunner<wasm::ModuleRunner> *this,RefIsNull *curr)

{
  bool bVar1;
  Literal *pLVar2;
  undefined1 local_78 [8];
  Flow flow;
  
  visit((Flow *)local_78,this,curr->value);
  if (flow.breakTo.super_IString.str._M_len == 0) {
    pLVar2 = Flow::getSingleValue((Flow *)local_78);
    bVar1 = Type::isNull(&pLVar2->type);
    flow.breakTo.super_IString.str._M_str._0_4_ = (uint)bVar1;
    Flow::Flow(__return_storage_ptr__,(Literal *)&flow.breakTo.super_IString.str._M_str);
    ::wasm::Literal::~Literal((Literal *)&flow.breakTo.super_IString.str._M_str);
  }
  else {
    Flow::Flow(__return_storage_ptr__,(Flow *)local_78);
  }
  SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)local_78);
  return __return_storage_ptr__;
}

Assistant:

Flow visitRefIsNull(RefIsNull* curr) {
    NOTE_ENTER("RefIsNull");
    Flow flow = visit(curr->value);
    if (flow.breaking()) {
      return flow;
    }
    const auto& value = flow.getSingleValue();
    NOTE_EVAL1(value);
    return Literal(int32_t(value.isNull()));
  }